

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

void __thiscall AActor::Thrust(AActor *this,double speed)

{
  double dVar1;
  double speed_local;
  AActor *this_local;
  
  dVar1 = TAngle<double>::Cos(&(this->Angles).Yaw);
  (this->Vel).X = speed * dVar1 + (this->Vel).X;
  dVar1 = TAngle<double>::Sin(&(this->Angles).Yaw);
  (this->Vel).Y = speed * dVar1 + (this->Vel).Y;
  return;
}

Assistant:

void Thrust(double speed)
	{
		Vel.X += speed * Angles.Yaw.Cos();
		Vel.Y += speed * Angles.Yaw.Sin();
	}